

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O2

prsndef * prsxun(prscxdef *ctx,prsbdef *binctx)

{
  tokdef *tokp;
  uchar uVar1;
  int iVar2;
  prsndef *ppVar3;
  prsndef *ppVar4;
  prsndef *n3;
  int t;
  uint t_00;
  tokcxdef *ptVar5;
  prsndef *node;
  tokdef tok;
  
  ptVar5 = ctx->prscxtok;
  t_00 = (ptVar5->tokcxcur).toktyp;
  if ((0x1e < t_00) || ((0x4000004cU >> (t_00 & 0x1f) & 1) == 0)) {
    if (t_00 == 0x5e) {
      iVar2 = toknext(ptVar5);
      if (iVar2 == 0x49) {
        toknext(ctx->prscxtok);
        tok.toktyp = 0x5e;
        ppVar3 = prsnew0(ctx,&tok);
        return ppVar3;
      }
      ppVar3 = prsxun(ctx,binctx);
      t_00 = 0x5e;
      goto LAB_0011eec8;
    }
    if (((t_00 != 0x5f) && (t_00 != 0x96)) && (t_00 != 0x98)) {
      tokp = &ptVar5->tokcxcur;
      switch(t_00) {
      case 0x32:
        toknext(ptVar5);
        ppVar3 = prsxexp(ctx,0);
        prsreq(ctx,0x33);
        goto LAB_0011f050;
      case 0x33:
      case 0x34:
      case 0x39:
switchD_0011ee86_caseD_33:
        errsigf(ctx->prscxerr,"TADS",0x12f);
      case 0x38:
        ppVar3 = prsnew0(ctx,tokp);
        toknext(ctx->prscxtok);
        if (((ppVar3->prsnv).prsnvt.toksym.tokstyp != '\t') || (tokp->toktyp != 0x38))
        goto LAB_0011f050;
        ppVar3 = prsnew0(ctx,tokp);
        ppVar3 = prsnew1(ctx,0x20,ppVar3);
        break;
      case 0x3a:
        ppVar3 = (prsndef *)0x0;
        do {
          toknext(ptVar5);
          do {
            if ((ctx->prscxtok->tokcxcur).toktyp == 0x3b) {
              toknext(ctx->prscxtok);
              if (ppVar3 != (prsndef *)0x0) goto LAB_0011f050;
              tok.toktyp = 0x4c;
              tok.tokofs = 0;
              goto LAB_0011f03a;
            }
            ppVar4 = prsxexp(ctx,1);
            ppVar3 = prsnew2(ctx,0x3b,ppVar4,ppVar3);
            ptVar5 = ctx->prscxtok;
          } while ((ptVar5->tokcxcur).toktyp != 0x3f);
        } while( true );
      default:
        if (1 < t_00 - 0x4d) {
          if ((t_00 != 0xe) && (t_00 != 0x55)) goto switchD_0011ee86_caseD_33;
          toknext(ptVar5);
          if (((ctx->prscxtok->tokcxcur).toktyp != 0x38) ||
             ((uVar1 = (ctx->prscxtok->tokcxcur).toksym.tokstyp, uVar1 != '\b' && (uVar1 != '\x01'))
             )) {
            tok.tokofs = prsrqpr(ctx);
            tok.toktyp = 0x55;
LAB_0011f03a:
            ppVar3 = prsnew0(ctx,&tok);
            goto LAB_0011f050;
          }
        }
      case 0x35:
      case 0x36:
      case 0x37:
        ppVar3 = prsnew0(ctx,tokp);
      }
      toknext(ctx->prscxtok);
LAB_0011f050:
      do {
        ptVar5 = ctx->prscxtok;
        iVar2 = (ptVar5->tokcxcur).toktyp;
        if (iVar2 != 0x32) {
          if (iVar2 == 0x3a) {
            if ((ctx->prscxflg & 4) != 0) {
              return ppVar3;
            }
            toknext(ptVar5);
            ppVar4 = prsxexp(ctx,0);
            ppVar3 = prsnew2(ctx,0x3a,ppVar3,ppVar4);
            prsreq(ctx,0x3b);
          }
          else {
            if (iVar2 != 0x40) {
              if ((iVar2 != 0x96) && (iVar2 != 0x98)) {
                return ppVar3;
              }
              ppVar3 = prsnew1(ctx,iVar2 + 1,ppVar3);
              toknext(ctx->prscxtok);
              return ppVar3;
            }
            iVar2 = toknext(ptVar5);
            ptVar5 = ctx->prscxtok;
            if (iVar2 == 0x32) {
              toknext(ptVar5);
              ppVar4 = prsxexp(ctx,0);
              prsreq(ctx,0x33);
            }
            else if (((ptVar5->tokcxcur).toktyp == 0x38) &&
                    ((ptVar5->tokcxcur).toksym.tokstyp == '\x04')) {
              ppVar4 = prsnew0(ctx,&ptVar5->tokcxcur);
              toknext(ctx->prscxtok);
            }
            else {
              tok.tokofs = prsrqpr(ctx);
              tok.toktyp = 0x55;
              ppVar4 = prsnew0(ctx,&tok);
            }
            t = 0x40;
            if ((ctx->prscxtok->tokcxcur).toktyp == 0x32) {
              toknext(ctx->prscxtok);
              n3 = prsxarg(ctx);
              ppVar3 = prsnew3(ctx,0x40,ppVar3,ppVar4,n3);
            }
            else {
LAB_0011f1b7:
              ppVar3 = prsnew2(ctx,t,ppVar3,ppVar4);
            }
          }
          goto LAB_0011f050;
        }
        iVar2 = toknext(ptVar5);
        t = 0x32;
        if (iVar2 != 0x33) {
          ppVar4 = prsxarg(ctx);
          goto LAB_0011f1b7;
        }
        toknext(ctx->prscxtok);
        ppVar3 = prsnew1(ctx,0x32,ppVar3);
      } while( true );
    }
  }
  toknext(ptVar5);
  ppVar3 = prsxun(ctx,binctx);
LAB_0011eec8:
  ppVar3 = prsnew1(ctx,t_00,ppVar3);
  return ppVar3;
}

Assistant:

static prsndef *prsxun(prscxdef *ctx, prsbdef *binctx)
{
    int      t;
    
    VARUSED(binctx);

    t = ctx->prscxtok->tokcxcur.toktyp;
    if (t == TOKTPLUS || t == TOKTMINUS || t == TOKTNOT
        || t == TOKTINC || t == TOKTDEC || t == TOKTTILDE
        || t == TOKTDELETE)
    {
        toknext(ctx->prscxtok);
        return(prsnew1(ctx, t, prsxun(ctx, (prsbdef *)0)));
    }
    else if (t == TOKTNEW)
    {
        if (toknext(ctx->prscxtok) == TOKTOBJECT)
        {
            tokdef tok;

            toknext(ctx->prscxtok);
            tok.toktyp = TOKTNEW;
            return prsnew0(ctx, &tok);
        }
        else
            return prsnew1(ctx, t, prsxun(ctx, (prsbdef *)0));
    }
    return(prsxmem(ctx));
}